

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

void __thiscall
TMap<int,_EDLinedef,_THashTraits<int>,_TValueTraits<EDLinedef>_>::Resize
          (TMap<int,_EDLinedef,_THashTraits<int>,_TValueTraits<EDLinedef>_> *this,hash_t nhsize)

{
  undefined8 *puVar1;
  uint uVar2;
  Node *block;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  double dVar8;
  Node *pNVar9;
  long lVar10;
  
  uVar2 = this->Size;
  block = this->Nodes;
  SetNodeVector(this,nhsize);
  this->NumUsed = 0;
  if ((ulong)uVar2 != 0) {
    lVar10 = 0;
    do {
      if (*(long *)((long)(block->Pair).Value.args + lVar10 + -0x20) != 1) {
        pNVar9 = NewKey(this,*(int *)((long)(block->Pair).Value.args + lVar10 + -0x18));
        puVar1 = (undefined8 *)((long)(block->Pair).Value.args + lVar10 + -0x10);
        uVar3 = *puVar1;
        uVar4 = puVar1[1];
        puVar1 = (undefined8 *)((long)(block->Pair).Value.args + lVar10);
        uVar5 = *puVar1;
        uVar6 = puVar1[1];
        puVar1 = (undefined8 *)((long)(block->Pair).Value.args + lVar10 + 0x10);
        uVar7 = *puVar1;
        dVar8 = (double)puVar1[1];
        (pNVar9->Pair).Value.recordnum = (int)uVar3;
        (pNVar9->Pair).Value.special = (int)((ulong)uVar3 >> 0x20);
        (pNVar9->Pair).Value.tag = (int)uVar4;
        (pNVar9->Pair).Value.id = (int)((ulong)uVar4 >> 0x20);
        *(undefined8 *)(pNVar9->Pair).Value.args = uVar5;
        *(undefined8 *)((pNVar9->Pair).Value.args + 2) = uVar6;
        *(undefined8 *)((pNVar9->Pair).Value.args + 4) = uVar7;
        (pNVar9->Pair).Value.alpha = dVar8;
        uVar3 = *(undefined8 *)((long)(block->Pair).Value.args + lVar10 + 0x20);
        (pNVar9->Pair).Value.flags = (int)uVar3;
        (pNVar9->Pair).Value.activation = (int)((ulong)uVar3 >> 0x20);
      }
      lVar10 = lVar10 + 0x48;
    } while ((ulong)uVar2 * 0x48 != lVar10);
  }
  M_Free(block);
  return;
}

Assistant:

void Resize(hash_t nhsize)
	{
		hash_t i, oldhsize = Size;
		Node *nold = Nodes;
		/* create new hash part with appropriate size */
		SetNodeVector(nhsize);
		/* re-insert elements from hash part */
		NumUsed = 0;
		for (i = 0; i < oldhsize; ++i)
		{
			if (!nold[i].IsNil())
			{
				Node *n = NewKey(nold[i].Pair.Key);
				::new(&n->Pair.Value) VT(nold[i].Pair.Value);
				nold[i].~Node();
			}
		}
		M_Free(nold);
	}